

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O3

PatternEquation *
WithBlock::collectAndPrependPattern
          (list<WithBlock,_std::allocator<WithBlock>_> *stack,PatternEquation *pateq)

{
  _List_node_base *p_Var1;
  PatternEquation *pPVar2;
  PatternEquation *this;
  
  for (p_Var1 = (stack->super__List_base<WithBlock,_std::allocator<WithBlock>_>)._M_impl._M_node.
                super__List_node_base._M_next; p_Var1 != (_List_node_base *)stack;
      p_Var1 = (((_List_base<WithBlock,_std::allocator<WithBlock>_> *)&p_Var1->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    pPVar2 = (PatternEquation *)p_Var1[1]._M_prev;
    this = pateq;
    if (pPVar2 != (PatternEquation *)0x0) {
      this = (PatternEquation *)operator_new(0x48);
      EquationAnd::EquationAnd((EquationAnd *)this,pPVar2,pateq);
    }
    pateq = this;
  }
  return pateq;
}

Assistant:

PatternEquation *WithBlock::collectAndPrependPattern(const list<WithBlock> &stack, PatternEquation *pateq)

{
  list<WithBlock>::const_iterator iter;
  for(iter=stack.begin();iter!=stack.end();++iter) {
    PatternEquation *witheq = (*iter).pateq;
    if (witheq != (PatternEquation *)0)
      pateq = new EquationAnd(witheq, pateq);
  }
  return pateq;
}